

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

uint32_t __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_uint32
          (GLAttributeBuffer *this,size_t ind)

{
  uint uVar1;
  string local_40;
  
  if ((this->super_AttributeBuffer).dataType != UInt) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bad getData type","");
    exception(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  uVar1 = getData_helper<unsigned_int>(this,ind);
  return uVar1;
}

Assistant:

uint32_t GLAttributeBuffer::getData_uint32(size_t ind) {
  if (getType() != RenderDataType::UInt) exception("bad getData type");
  return getData_helper<uint32_t>(ind);
}